

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode cw_download_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  void *pvVar1;
  CURLcode CVar2;
  size_t sVar3;
  bool bVar4;
  size_t wmax_1;
  size_t wmax;
  long lStack_58;
  _Bool is_connect;
  size_t excess_len;
  size_t nwrite;
  CURLcode result;
  cw_download_ctx *ctx;
  size_t nbytes_local;
  char *buf_local;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  pvVar1 = writer->ctx;
  lStack_58 = 0;
  bVar4 = (type & 0x10U) == 0;
  if ((bVar4) && ((*(byte *)((long)pvVar1 + 0x20) & 1) == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
    *(byte *)((long)pvVar1 + 0x20) = *(byte *)((long)pvVar1 + 0x20) & 0xfe | 1;
  }
  if ((type & 1U) == 0) {
    if ((bVar4) || ((*(ulong *)&(data->set).field_0x89c >> 0x2d & 1) == 0)) {
      data_local._4_4_ = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
          (0 < Curl_trc_feat_write.log_level)))) {
        Curl_trc_write(data,"download_write header(type=%x, blen=%zu) -> %d",(ulong)(uint)type,
                       nbytes,(ulong)data_local._4_4_);
      }
    }
    else {
      data_local._4_4_ = CURLE_OK;
    }
  }
  else if (((*(uint *)&(data->req).field_0xd1 >> 0x11 & 1) == 0) || (nbytes == 0)) {
    excess_len = nbytes;
    if ((data->req).maxdownload != -1) {
      sVar3 = get_max_body_write_len(data,(data->req).maxdownload);
      excess_len = nbytes;
      if (sVar3 < nbytes) {
        lStack_58 = nbytes - sVar3;
        excess_len = sVar3;
      }
      if (excess_len == sVar3) {
        *(uint *)&(data->req).field_0xd1 = *(uint *)&(data->req).field_0xd1 & 0xfffffff7 | 8;
      }
      if ((((type & 0x80U) != 0) && ((*(uint *)&(data->req).field_0xd1 >> 0x11 & 1) == 0)) &&
         ((data->req).bytecount < (data->req).maxdownload)) {
        Curl_failf(data,"end of response with %ld bytes missing",
                   (data->req).maxdownload - (data->req).bytecount);
        return CURLE_PARTIAL_FILE;
      }
    }
    if ((((data->set).max_filesize != 0) && ((*(uint *)&(data->req).field_0xd1 >> 10 & 1) == 0)) &&
       (sVar3 = get_max_body_write_len(data,(data->set).max_filesize), sVar3 < excess_len)) {
      excess_len = sVar3;
    }
    if (((*(uint *)&(data->req).field_0xd1 >> 10 & 1) == 0) &&
       ((excess_len != 0 || ((type & 0x80U) != 0)))) {
      CVar2 = Curl_cwriter_write(data,writer->next,type,buf,excess_len);
      if ((data != (Curl_easy *)0x0) &&
         (((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0 &&
          ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
           (0 < Curl_trc_feat_write.log_level)))))) {
        Curl_trc_write(data,"download_write body(type=%x, blen=%zu) -> %d",(ulong)(uint)type,nbytes,
                       (ulong)CVar2);
      }
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    }
    (data->req).bytecount = excess_len + (data->req).bytecount;
    data_local._4_4_ = Curl_pgrsSetDownloadCounter(data,(data->req).bytecount);
    if (data_local._4_4_ == CURLE_OK) {
      if (lStack_58 == 0) {
        if ((excess_len < nbytes) && ((*(uint *)&(data->req).field_0xd1 >> 10 & 1) == 0)) {
          Curl_failf(data,"Exceeded the maximum allowed file size (%ld) with %ld bytes",
                     (data->set).max_filesize,(data->req).bytecount);
          return CURLE_FILESIZE_EXCEEDED;
        }
      }
      else if ((*(uint *)&(data->req).field_0xd1 >> 10 & 1) == 0) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,
                     "Excess found writing body: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld"
                     ,lStack_58,(data->req).size,(data->req).maxdownload,(data->req).bytecount);
        }
        Curl_conncontrol(data->conn,1);
      }
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    Curl_conncontrol(data->conn,2);
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write(data,"download_write body(type=%x, blen=%zu), did not want a BODY",
                     (ulong)(uint)type,nbytes);
    }
    *(uint *)&(data->req).field_0xd1 = *(uint *)&(data->req).field_0xd1 & 0xfffffff7 | 8;
    if ((data->info).header_size == 0) {
      data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
    }
    else {
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode cw_download_write(struct Curl_easy *data,
                                  struct Curl_cwriter *writer, int type,
                                  const char *buf, size_t nbytes)
{
  struct cw_download_ctx *ctx = writer->ctx;
  CURLcode result;
  size_t nwrite, excess_len = 0;
  bool is_connect = !!(type & CLIENTWRITE_CONNECT);

  if(!is_connect && !ctx->started_response) {
    Curl_pgrsTime(data, TIMER_STARTTRANSFER);
    ctx->started_response = TRUE;
  }

  if(!(type & CLIENTWRITE_BODY)) {
    if(is_connect && data->set.suppress_connect_headers)
      return CURLE_OK;
    result = Curl_cwriter_write(data, writer->next, type, buf, nbytes);
    CURL_TRC_WRITE(data, "download_write header(type=%x, blen=%zu) -> %d",
                   type, nbytes, result);
    return result;
  }

  /* Here, we deal with REAL BODY bytes. All filtering and transfer
   * encodings have been applied and only the true content, e.g. BODY,
   * bytes are passed here.
   * This allows us to check sizes, update stats, etc. independent
   * from the protocol in play. */

  if(data->req.no_body && nbytes > 0) {
    /* BODY arrives although we want none, bail out */
    streamclose(data->conn, "ignoring body");
    CURL_TRC_WRITE(data, "download_write body(type=%x, blen=%zu), "
                   "did not want a BODY", type, nbytes);
    data->req.download_done = TRUE;
    if(data->info.header_size)
      /* if headers have been received, this is fine */
      return CURLE_OK;
    return CURLE_WEIRD_SERVER_REPLY;
  }

  /* Determine if we see any bytes in excess to what is allowed.
   * We write the allowed bytes and handle excess further below.
   * This gives deterministic BODY writes on varying buffer receive
   * lengths. */
  nwrite = nbytes;
  if(-1 != data->req.maxdownload) {
    size_t wmax = get_max_body_write_len(data, data->req.maxdownload);
    if(nwrite > wmax) {
      excess_len = nbytes - wmax;
      nwrite = wmax;
    }

    if(nwrite == wmax) {
      data->req.download_done = TRUE;
    }

    if((type & CLIENTWRITE_EOS) && !data->req.no_body &&
       (data->req.maxdownload > data->req.bytecount)) {
      failf(data, "end of response with %" FMT_OFF_T " bytes missing",
            data->req.maxdownload - data->req.bytecount);
      return CURLE_PARTIAL_FILE;
    }
  }

  /* Error on too large filesize is handled below, after writing
   * the permitted bytes */
  if(data->set.max_filesize && !data->req.ignorebody) {
    size_t wmax = get_max_body_write_len(data, data->set.max_filesize);
    if(nwrite > wmax) {
      nwrite = wmax;
    }
  }

  if(!data->req.ignorebody && (nwrite || (type & CLIENTWRITE_EOS))) {
    result = Curl_cwriter_write(data, writer->next, type, buf, nwrite);
    CURL_TRC_WRITE(data, "download_write body(type=%x, blen=%zu) -> %d",
                   type, nbytes, result);
    if(result)
      return result;
  }
  /* Update stats, write and report progress */
  data->req.bytecount += nwrite;
  result = Curl_pgrsSetDownloadCounter(data, data->req.bytecount);
  if(result)
    return result;

  if(excess_len) {
    if(!data->req.ignorebody) {
      infof(data,
            "Excess found writing body:"
            " excess = %zu"
            ", size = %" FMT_OFF_T
            ", maxdownload = %" FMT_OFF_T
            ", bytecount = %" FMT_OFF_T,
            excess_len, data->req.size, data->req.maxdownload,
            data->req.bytecount);
      connclose(data->conn, "excess found in a read");
    }
  }
  else if((nwrite < nbytes) && !data->req.ignorebody) {
    failf(data, "Exceeded the maximum allowed file size "
          "(%" FMT_OFF_T ") with %" FMT_OFF_T " bytes",
          data->set.max_filesize, data->req.bytecount);
    return CURLE_FILESIZE_EXCEEDED;
  }

  return CURLE_OK;
}